

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

tensor * __thiscall
dlib::tensor::operator=
          (tensor *this,
          matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
          *item)

{
  longlong lVar1;
  long lVar2;
  assignable_ptr_matrix<float> *this_00;
  long lVar3;
  ostream *poVar4;
  ostream *poVar5;
  string *a;
  undefined8 uVar6;
  tensor *in_RDI;
  ostringstream dlib_o_out;
  long in_stack_fffffffffffffda0;
  long in_stack_fffffffffffffda8;
  float *in_stack_fffffffffffffdb0;
  error_type t;
  matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
  *in_stack_fffffffffffffdf8;
  ostringstream local_188 [392];
  
  lVar1 = num_samples(in_RDI);
  lVar2 = matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
          ::nr((matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                *)0x27b621);
  if (lVar1 == lVar2) {
    this_00 = (assignable_ptr_matrix<float> *)nr(in_RDI);
    lVar1 = nc(in_RDI);
    lVar2 = (long)this_00 * lVar1;
    lVar1 = k(in_RDI);
    lVar3 = matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
            ::nc((matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                  *)0x27b68c);
    if (lVar2 * lVar1 == lVar3) {
      (*in_RDI->_vptr_tensor[4])();
      set_ptrm<float>(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0)
      ;
      assignable_ptr_matrix<float>::operator=(this_00,in_stack_fffffffffffffdf8);
      return in_RDI;
    }
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar4 = std::operator<<((ostream *)local_188,"\n\nError detected at line ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x79);
  std::operator<<(poVar4,".\n");
  poVar4 = std::operator<<((ostream *)local_188,"Error detected in file ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor.h"
                          );
  std::operator<<(poVar4,".\n");
  poVar4 = std::operator<<((ostream *)local_188,"Error detected in function ");
  poVar4 = std::operator<<(poVar4,
                           "tensor &dlib::tensor::operator=(const matrix_exp<EXP> &) [EXP = dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>, dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>, dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>]"
                          );
  std::operator<<(poVar4,".\n\n");
  poVar4 = std::operator<<((ostream *)local_188,"Failing expression was ");
  poVar5 = std::operator<<(poVar4,"num_samples() == item.nr() && nr()*nc()*k() == item.nc()");
  std::operator<<(poVar5,".\n");
  t = (error_type)((ulong)poVar5 >> 0x20);
  a = (string *)std::ostream::operator<<(local_188,std::boolalpha);
  poVar5 = std::operator<<((ostream *)a,"");
  std::operator<<(poVar5,"\n");
  uVar6 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error((fatal_error *)poVar4,t,a);
  __cxa_throw(uVar6,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

tensor& operator= (const matrix_exp<EXP>& item)
        {
            DLIB_CASSERT(num_samples() == item.nr() &&
                         nr()*nc()*k() == item.nc());
            static_assert((is_same_type<float, typename EXP::type>::value == true),
                "To assign a matrix to a tensor the matrix must contain float values");

            set_ptrm(host_write_only(), m_n, m_nr*m_nc*m_k) = item;
            return *this;
        }